

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.hpp
# Opt level: O0

endpoint * __thiscall
asio::detail::deref_connect_result<asio::ip::tcp,asio::ip::basic_resolver_iterator<asio::ip::tcp>>
          (endpoint *__return_storage_ptr__,detail *this,
          basic_resolver_iterator<asio::ip::tcp> *iter,error_code *ec)

{
  bool bVar1;
  basic_resolver_entry<asio::ip::tcp> *this_00;
  error_code *ec_local;
  basic_resolver_iterator<asio::ip::tcp> *iter_local;
  
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)iter);
  if (bVar1) {
    ip::basic_endpoint<asio::ip::tcp>::basic_endpoint(__return_storage_ptr__);
  }
  else {
    this_00 = ip::basic_resolver_iterator<asio::ip::tcp>::operator*
                        ((basic_resolver_iterator<asio::ip::tcp> *)this);
    ip::basic_resolver_entry::operator_cast_to_basic_endpoint
              (__return_storage_ptr__,(basic_resolver_entry *)this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

inline typename Protocol::endpoint deref_connect_result(
      Iterator iter, asio::error_code& ec)
  {
    return ec ? typename Protocol::endpoint() : *iter;
  }